

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O1

double ** clone_matrix<double>(double **matrix,int row,int col)

{
  double *pdVar1;
  double *pdVar2;
  double **ppdVar3;
  ulong uVar4;
  ulong uVar5;
  
  ppdVar3 = new_matrix<double>(row,col);
  if (0 < row) {
    uVar4 = 0;
    do {
      if (0 < col) {
        pdVar1 = matrix[uVar4];
        pdVar2 = ppdVar3[uVar4];
        uVar5 = 0;
        do {
          pdVar2[uVar5] = pdVar1[uVar5];
          uVar5 = uVar5 + 1;
        } while ((uint)col != uVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)row);
  }
  return ppdVar3;
}

Assistant:

T** clone_matrix(T** matrix, int row, int col)
{
    T** ret_val = new_matrix<T>(row, col);

    for (int i = 0; i < row; ++i) {
        for (int j = 0; j < col; ++j) {
            ret_val[i][j] = matrix[i][j];
        }
    }

    return ret_val;
}